

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O2

void __thiscall
klogic::learning::
teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
::
learn_run<klogic::learning::learn_always<klogic::learning::sample<std::complex<double>>,std::complex<double>>>
          (teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
           *this,learn_always<klogic::learning::sample<std::complex<double>_>,_std::complex<double>_>
                 *picker)

{
  pointer *X;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double local_28;
  double dStack_20;
  
  for (X = *(pointer **)this; (cvector *)X != *(cvector **)(this + 8); X = X + 5) {
    mvn::output(*(mvn **)(this + 0x18),(cvector *)X);
    local_28 = (double)(((cvector *)(X + 3))->
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start - extraout_XMM0_Qa;
    dStack_20 = (double)X[4] - in_XMM1_Qa;
    mvn::learn(*(mvn **)(this + 0x18),(cvector *)X,(cmplx *)&local_28,1.0,false);
  }
  return;
}

Assistant:

void learn_run(SamplePicker const &picker = SamplePicker()) {
                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    if (picker(*i, actual))
                        learner.learn(i->input, learn_error(actual, i->desired));
                }
            }